

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorPropertyFactored
          (FBXConverter *this,PropertyTable *props,string *colorName,string *factorName,bool *result
          ,bool useTemplate)

{
  PropertyTable *pPVar1;
  Property *pPVar2;
  long lVar3;
  undefined7 in_register_00000089;
  bool bVar4;
  bool bVar5;
  float fVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  aiColor3D aVar11;
  char in_stack_00000008;
  
  *(undefined1 *)CONCAT71(in_register_00000089,useTemplate) = 1;
  pPVar2 = PropertyTable::Get((PropertyTable *)colorName,factorName);
  if (pPVar2 == (Property *)0x0) {
    if (in_stack_00000008 != '\0') {
      pPVar1 = (PropertyTable *)colorName[3]._M_dataplus._M_p;
      if (pPVar1 == (PropertyTable *)0x0) {
        bVar4 = false;
        pPVar2 = (Property *)0x0;
      }
      else {
        pPVar2 = PropertyTable::Get(pPVar1,factorName);
        bVar4 = pPVar2 != (Property *)0x0;
      }
      if (bVar4) goto LAB_005fb88c;
    }
    fVar9 = 0.0;
    fVar6 = 0.0;
    fVar8 = 0.0;
    bVar4 = false;
  }
  else {
LAB_005fb88c:
    bVar4 = false;
    lVar3 = __dynamic_cast(pPVar2,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo);
    if (lVar3 == 0) {
      fVar6 = 0.0;
      fVar9 = 0.0;
      fVar8 = 0.0;
    }
    else {
      fVar6 = (float)*(undefined8 *)(lVar3 + 8);
      fVar9 = (float)((ulong)*(undefined8 *)(lVar3 + 8) >> 0x20);
      fVar8 = *(float *)(lVar3 + 0x10);
      bVar4 = true;
    }
  }
  if (!bVar4) {
    *(undefined1 *)CONCAT71(in_register_00000089,useTemplate) = 0;
    fVar6 = 0.0;
    uVar7 = 0;
    fVar8 = 0.0;
    goto LAB_005fb9d8;
  }
  if (*(long *)(result + 8) != 0) {
    pPVar2 = PropertyTable::Get((PropertyTable *)colorName,(string *)result);
    if (pPVar2 == (Property *)0x0) {
      fVar10 = 0.0;
      if (in_stack_00000008 == '\0') {
        bVar4 = false;
      }
      else {
        pPVar1 = (PropertyTable *)colorName[3]._M_dataplus._M_p;
        if (pPVar1 == (PropertyTable *)0x0) {
          bVar4 = false;
          bVar5 = false;
          pPVar2 = (Property *)0x0;
        }
        else {
          pPVar2 = PropertyTable::Get(pPVar1,(string *)result);
          bVar5 = pPVar2 == (Property *)0x0;
          if (bVar5) {
            bVar4 = false;
            pPVar2 = (Property *)0x0;
          }
          bVar5 = !bVar5;
        }
        fVar10 = 0.0;
        if (bVar5) goto LAB_005fb925;
      }
    }
    else {
LAB_005fb925:
      lVar3 = __dynamic_cast(pPVar2,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
      if (lVar3 == 0) {
        fVar10 = 0.0;
      }
      else {
        fVar10 = *(float *)(lVar3 + 8);
      }
      bVar4 = lVar3 != 0;
    }
    if (bVar4) {
      fVar6 = fVar6 * fVar10;
      fVar9 = fVar9 * fVar10;
      fVar8 = fVar8 * fVar10;
    }
  }
  uVar7 = CONCAT44(fVar9,fVar9);
LAB_005fb9d8:
  this->defaultMaterialIndex = (uint)fVar6;
  *(int *)&this->field_0x4 = (int)uVar7;
  *(float *)&(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start = fVar8;
  aVar11.b = fVar8;
  aVar11.r = (ai_real)(int)uVar7;
  aVar11.g = (ai_real)(int)((ulong)uVar7 >> 0x20);
  return aVar11;
}

Assistant:

aiColor3D FBXConverter::GetColorPropertyFactored(const PropertyTable& props, const std::string& colorName,
            const std::string& factorName, bool& result, bool useTemplate)
        {
            result = true;

            bool ok;
            aiVector3D BaseColor = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }

            // if no factor name, return the colour as is
            if (factorName.empty()) {
                return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
            }

            // otherwise it should be multiplied by the factor, if found.
            float factor = PropertyGet<float>(props, factorName, ok, useTemplate);
            if (ok) {
                BaseColor *= factor;
            }
            return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
        }